

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_example.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::ApiExample::DealableStreams
          (ApiExample *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *liquidity_providers)

{
  pointer pbVar1;
  BulkSubscriber *pBVar2;
  long lVar3;
  string *psVar4;
  undefined8 *puVar5;
  Tenor *pTVar6;
  Date *pDVar7;
  Date *pDVar8;
  pointer pbVar9;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  ApiExample *local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  Subject subject3;
  string local_168 [32];
  Subject subject2;
  string local_130 [32];
  string lp;
  Subject subject1;
  string local_d8 [32];
  Subject local_b8 [24];
  Subject local_a0 [24];
  Subject local_88 [24];
  MandatoryFieldsSubjectCreator local_70 [64];
  
  pbVar1 = (liquidity_providers->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_1a8 = this;
  for (pbVar9 = (liquidity_providers->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar1; pbVar9 = pbVar9 + 1) {
    std::__cxx11::string::string((string *)&lp,(string *)pbVar9);
    _subject3 = (**(code **)(*(long *)(local_1a8->subscriber_)._M_t.
                                      super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                      .
                                      super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>
                                      ._M_head_impl + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    _subject2 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Spot();
    psVar4 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::LiquidityProvider
                       (local_168);
    std::__cxx11::string::string<std::allocator<char>>
              (local_130,"EURUSD",(allocator<char> *)&local_1a0);
    psVar4 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::CurrencyPair(psVar4);
    std::__cxx11::string::string<std::allocator<char>>(local_d8,"EUR",(allocator<char> *)&local_198)
    ;
    bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Currency(psVar4);
    puVar5 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Quantity(1230080.11);
    (**(code **)*puVar5)(&subject1,puVar5);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_130);
    price::subject::SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
              (local_70);
    pBVar2 = (local_1a8->subscriber_)._M_t.
             super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ._M_t.
             super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
    lVar3 = *(long *)(*(long *)pBVar2 + -0x30);
    bidfx_public_api::price::subject::Subject::Subject(local_88,&subject1);
    (**(code **)(*(long *)(pBVar2 + lVar3) + 8))(pBVar2 + lVar3,local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_88);
    local_1a0 = (**(code **)(*(long *)(local_1a8->subscriber_)._M_t.
                                      super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                      .
                                      super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>
                                      ._M_head_impl + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    _subject3 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Forward();
    psVar4 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                       (local_130);
    std::__cxx11::string::string<std::allocator<char>>
              (local_d8,"EURUSD",(allocator<char> *)&local_198);
    psVar4 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar4);
    std::__cxx11::string::string<std::allocator<char>>(local_168,"EUR",&local_1aa);
    bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar4);
    pTVar6 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                                (1000000.0);
    puVar5 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar6);
    (**(code **)*puVar5)(&subject2,puVar5);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_d8);
    price::subject::SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
              (local_70);
    pBVar2 = (local_1a8->subscriber_)._M_t.
             super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ._M_t.
             super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
    lVar3 = *(long *)(*(long *)pBVar2 + -0x30);
    bidfx_public_api::price::subject::Subject::Subject(local_a0,&subject2);
    (**(code **)(*(long *)(pBVar2 + lVar3) + 8))(pBVar2 + lVar3,local_a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a0);
    local_198 = (**(code **)(*(long *)(local_1a8->subscriber_)._M_t.
                                      super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
                                      .
                                      super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>
                                      ._M_head_impl + 0x38))();
    bidfx_public_api::price::subject::SubjectFactory::Fx();
    local_1a0 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
    bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Ndf();
    psVar4 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider
                       (local_130);
    std::__cxx11::string::string<std::allocator<char>>(local_d8,"USDKRW",&local_1aa);
    psVar4 = (string *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar4);
    std::__cxx11::string::string<std::allocator<char>>(local_168,"USD",&local_1a9);
    bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar4);
    pTVar6 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity
                                (2000000.0);
    pDVar7 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar6);
    pDVar8 = (Date *)operator_new(0xc);
    bidfx_public_api::tools::Date::Date(pDVar8,0x7e3,0xc,10);
    pDVar7 = (Date *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::FixingDate
                               (pDVar7);
    pDVar8 = (Date *)operator_new(0xc);
    bidfx_public_api::tools::Date::Date(pDVar8,0x7e3,0xc,0xc);
    puVar5 = (undefined8 *)
             bidfx_public_api::price::subject::SubjectFactory::FX::Forward::SettlementDate(pDVar7);
    (**(code **)*puVar5)(&subject3,puVar5);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_d8);
    price::subject::SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
              (local_70);
    pBVar2 = (local_1a8->subscriber_)._M_t.
             super___uniq_ptr_impl<bidfx_public_api::BulkSubscriber,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             ._M_t.
             super__Tuple_impl<0UL,_bidfx_public_api::BulkSubscriber_*,_std::default_delete<bidfx_public_api::BulkSubscriber>_>
             .super__Head_base<0UL,_bidfx_public_api::BulkSubscriber_*,_false>._M_head_impl;
    lVar3 = *(long *)(*(long *)pBVar2 + -0x30);
    bidfx_public_api::price::subject::Subject::Subject(local_b8,&subject3);
    (**(code **)(*(long *)(pBVar2 + lVar3) + 8))(pBVar2 + lVar3,local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&subject3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&subject2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&subject1);
    std::__cxx11::string::~string((string *)&lp);
  }
  return;
}

Assistant:

void ApiExample::DealableStreams(std::vector<std::string> liquidity_providers)
{
    for (std::string lp : liquidity_providers)
    {
        Subject subject1 = subscriber_->Subjects().Fx().Stream().Spot()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1230080.11)
                .CreateSubject();

        subscriber_->Subscribe(subject1);
        //subscriber_->Unsubscribe(subject1);

        Subject subject2 = subscriber_->Subjects().Fx().Stream().Forward()
                .LiquidityProvider(lp)
                .CurrencyPair("EURUSD")
                .Currency("EUR")
                .Quantity(1000000)
                .Tenor(Tenor::IN_1_MONTH)
                .CreateSubject();

        subscriber_->Subscribe(subject2);
        //subscriber_->Unsubscribe(subject2);

        Subject subject3 = subscriber_->Subjects().Fx().Stream().Ndf()
                .LiquidityProvider(lp)
                .CurrencyPair("USDKRW")
                .Currency("USD")
                .Quantity(2000000)
                .Tenor(Tenor::IN_1_YEAR)
                .FixingDate(new Date(2019, 12, 10))
                .SettlementDate(new Date(2019, 12, 12))
                .CreateSubject();

        subscriber_->Subscribe(subject3);
        //subscriber_->Unsubscribe(subject3);
    }
}